

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::FindUnsatisfiedPrerequisites
          (ExpectationBase *this,ExpectationSet *result)

{
  bool bVar1;
  pointer pEVar2;
  linked_ptr<testing::internal::ExpectationBase> *plVar3;
  ExpectationBase *pEVar4;
  reference e;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  ExpectationSet *result_local;
  ExpectationBase *this_local;
  
  it._M_node = (_Base_ptr)result;
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  local_20._M_node = (_Base_ptr)ExpectationSet::begin(&this->immediate_prerequisites_);
  while( true ) {
    local_28._M_node = (_Base_ptr)ExpectationSet::end(&this->immediate_prerequisites_);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_20);
    plVar3 = Expectation::expectation_base(pEVar2);
    pEVar4 = linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
    bVar1 = IsSatisfied(pEVar4);
    if (bVar1) {
      pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_20);
      plVar3 = Expectation::expectation_base(pEVar2);
      pEVar4 = linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
      if (pEVar4->call_count_ == 0) {
        pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_20);
        plVar3 = Expectation::expectation_base(pEVar2);
        pEVar4 = linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
        FindUnsatisfiedPrerequisites(pEVar4,(ExpectationSet *)it._M_node);
      }
    }
    else {
      e = std::_Rb_tree_const_iterator<testing::Expectation>::operator*(&local_20);
      ExpectationSet::operator+=((ExpectationSet *)it._M_node,e);
    }
    std::_Rb_tree_const_iterator<testing::Expectation>::operator++(&local_20);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    if (it->expectation_base()->IsSatisfied()) {
      // If *it is satisfied and has a call count of 0, some of its
      // pre-requisites may not be satisfied yet.
      if (it->expectation_base()->call_count_ == 0) {
        it->expectation_base()->FindUnsatisfiedPrerequisites(result);
      }
    } else {
      // Now that we know *it is unsatisfied, we are not so interested
      // in whether its pre-requisites are satisfied.  Therefore we
      // don't recursively call FindUnsatisfiedPrerequisites() here.
      *result += *it;
    }
  }
}